

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_fcmla_zpzzz_h_aarch64(CPUARMState_conflict *env,void *vg,uint32_t desc)

{
  ushort uVar1;
  ulong uVar2;
  float16 fVar3;
  float16 fVar4;
  float16 fVar5;
  float16 fVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  long lVar12;
  bool bVar13;
  ushort local_a0;
  ushort local_9c;
  bool local_93;
  float16 d;
  float16 mi;
  float16 mr;
  float16 ni;
  float16 nr;
  float16 e4;
  float16 e3;
  float16 e2;
  float16 e1;
  uint64_t pg;
  uint64_t *g;
  void *va;
  void *vm;
  void *vn;
  void *vd;
  float16 neg_real;
  float16 neg_imag;
  _Bool flip;
  uint rot;
  uint ra;
  uint rm;
  uint rn;
  uint rd;
  intptr_t i;
  intptr_t j;
  uint32_t desc_local;
  void *vg_local;
  CPUARMState_conflict *env_local;
  
  _rn = simd_oprsz(desc);
  uVar7 = extract32(desc,10,5);
  uVar8 = extract32(desc,0xf,5);
  uVar9 = extract32(desc,0x14,5);
  uVar10 = extract32(desc,0x19,5);
  uVar11 = extract32(desc,0x1e,2);
  bVar13 = (uVar11 & 1) != 0;
  fVar3 = float16_set_sign(0,(uint)((uVar11 & 2) != 0));
  local_93 = uVar11 == 1 || uVar11 == 2;
  fVar4 = float16_set_sign(0,(uint)local_93);
  do {
    uVar2 = *(ulong *)((long)vg + ((long)(_rn - 1) >> 6) * 8);
    do {
      lVar12 = _rn - 2;
      _rn = _rn - 4;
      fVar6 = *(float16 *)((long)(env->vfp).zregs[uVar8].d + _rn);
      uVar1 = *(ushort *)((long)(env->vfp).zregs[uVar9].d + _rn);
      local_a0 = *(ushort *)((long)(env->vfp).zregs[uVar9].d + lVar12);
      local_9c = uVar1;
      if (bVar13) {
        local_9c = local_a0;
        fVar6 = *(float16 *)((long)(env->vfp).zregs[uVar8].d + lVar12);
      }
      if (bVar13) {
        local_a0 = uVar1;
      }
      if ((uVar2 >> ((byte)_rn & 0x3f) & 1) != 0) {
        fVar5 = float16_muladd_aarch64
                          (fVar6,local_9c ^ fVar4,
                           *(float16 *)((long)(env->vfp).zregs[uVar10].d + _rn),0,
                           &(env->vfp).fp_status_f16);
        *(float16 *)((long)(env->vfp).zregs[uVar7].d + _rn) = fVar5;
      }
      if ((uVar2 >> ((byte)lVar12 & 0x3f) & 1) != 0) {
        fVar6 = float16_muladd_aarch64
                          (fVar6,local_a0 ^ fVar3,
                           *(float16 *)((long)(env->vfp).zregs[uVar10].d + lVar12),0,
                           &(env->vfp).fp_status_f16);
        *(float16 *)((long)(env->vfp).zregs[uVar7].d + lVar12) = fVar6;
      }
    } while ((_rn & 0x3f) != 0);
  } while (_rn != 0);
  return;
}

Assistant:

void HELPER(sve_fcmla_zpzzz_h)(CPUARMState *env, void *vg, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    unsigned rd = extract32(desc, SIMD_DATA_SHIFT, 5);
    unsigned rn = extract32(desc, SIMD_DATA_SHIFT + 5, 5);
    unsigned rm = extract32(desc, SIMD_DATA_SHIFT + 10, 5);
    unsigned ra = extract32(desc, SIMD_DATA_SHIFT + 15, 5);
    unsigned rot = extract32(desc, SIMD_DATA_SHIFT + 20, 2);
    bool flip = rot & 1;
    float16 neg_imag, neg_real;
    void *vd = &env->vfp.zregs[rd];
    void *vn = &env->vfp.zregs[rn];
    void *vm = &env->vfp.zregs[rm];
    void *va = &env->vfp.zregs[ra];
    uint64_t *g = vg;

    neg_imag = float16_set_sign(0, (rot & 2) != 0);
    neg_real = float16_set_sign(0, rot == 1 || rot == 2);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float16 e1, e2, e3, e4, nr, ni, mr, mi, d;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float16);
            i -= 2 * sizeof(float16);

            nr = *(float16 *)((char *)vn + H1_2(i));
            ni = *(float16 *)((char *)vn + H1_2(j));
            mr = *(float16 *)((char *)vm + H1_2(i));
            mi = *(float16 *)((char *)vm + H1_2(j));

            e2 = (flip ? ni : nr);
            e1 = (flip ? mi : mr) ^ neg_real;
            e4 = e2;
            e3 = (flip ? mr : mi) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                d = *(float16 *)((char *)va + H1_2(i));
                d = float16_muladd(e2, e1, d, 0, &env->vfp.fp_status_f16);
                *(float16 *)((char *)vd + H1_2(i)) = d;
            }
            if (likely((pg >> (j & 63)) & 1)) {
                d = *(float16 *)((char *)va + H1_2(j));
                d = float16_muladd(e4, e3, d, 0, &env->vfp.fp_status_f16);
                *(float16 *)((char *)vd + H1_2(j)) = d;
            }
        } while (i & 63);
    } while (i != 0);
}